

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

void __thiscall pbrt::ThreadPool::RemoveFromJobList(ThreadPool *this,ParallelJob *job)

{
  ParallelJob *pPVar1;
  ParallelJob *pPVar2;
  ParallelJob **ppPVar3;
  
  pPVar1 = job->prev;
  pPVar2 = job->next;
  ppPVar3 = &pPVar1->next;
  if (pPVar1 == (ParallelJob *)0x0) {
    ppPVar3 = &this->jobList;
  }
  *ppPVar3 = pPVar2;
  if (pPVar2 != (ParallelJob *)0x0) {
    pPVar2->prev = pPVar1;
  }
  job->removed = true;
  return;
}

Assistant:

void ThreadPool::RemoveFromJobList(ParallelJob *job) {
    DCHECK(!job->removed);

    if (job->prev != nullptr)
        job->prev->next = job->next;
    else {
        DCHECK(jobList == job);
        jobList = job->next;
    }
    if (job->next != nullptr)
        job->next->prev = job->prev;

    job->removed = true;
}